

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathCheckOpLimit(xmlXPathParserContextPtr ctxt,unsigned_long opCount)

{
  xmlXPathContextPtr pxVar1;
  ulong uVar2;
  
  pxVar1 = ctxt->context;
  uVar2 = pxVar1->opLimit;
  if ((opCount <= uVar2) && (pxVar1->opCount <= uVar2 - opCount)) {
    pxVar1->opCount = pxVar1->opCount + opCount;
    return 0;
  }
  pxVar1->opCount = uVar2;
  xmlXPathErr(ctxt,0x19);
  return -1;
}

Assistant:

static int
xmlXPathCheckOpLimit(xmlXPathParserContextPtr ctxt, unsigned long opCount) {
    xmlXPathContextPtr xpctxt = ctxt->context;

    if ((opCount > xpctxt->opLimit) ||
        (xpctxt->opCount > xpctxt->opLimit - opCount)) {
        xpctxt->opCount = xpctxt->opLimit;
        xmlXPathErr(ctxt, XPATH_OP_LIMIT_EXCEEDED);
        return(-1);
    }

    xpctxt->opCount += opCount;
    return(0);
}